

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

void __thiscall Indexing::ClauseCodeTree::ClauseMatcher::leaveLiteral(ClauseMatcher *this)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  ulong uVar2;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> res;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_20;
  
  pRVar1 = (this->lms)._cursor;
  (this->lms)._cursor = pRVar1 + -1;
  local_20._self._M_t.
  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
       (__uniq_ptr_data<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>,_true,_true>
        )pRVar1[-1]._self._M_t.
         super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
         .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
  pRVar1[-1]._self._M_t.
  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
  .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl =
       (LiteralMatcher *)0x0;
  ::Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((this->lms)._cursor);
  ::Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_20);
  pRVar1 = (this->lms)._cursor;
  uVar2 = (long)pRVar1 - (long)(this->lms)._stack;
  if (((uVar2 != 0) &&
      (*(undefined1 *)
        ((**(ulong **)
            &(pRVar1[-1]._self._M_t.
              super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
              ._M_t.
              super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
              .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl
             )->super_Matcher >> 3) + 0x39) = 1, this->sres == true)) &&
     (this->sresLiteral == (int)(uVar2 >> 4) - 1U)) {
    this->sresLiteral = 0xffffffff;
  }
  return;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::leaveLiteral()
{
  ASS(lms.isNonEmpty());

  lms.pop();

  if(lms.isNonEmpty()) {
    LiteralMatcher* prevLM = &*lms.top();
    ILStruct* ils=prevLM->op->getILS();
    ASS_EQ(ils->timestamp,tree->_curTimeStamp);
    ASS(ils->visited);

    ils->finished=true;

    if(sres) {
      //clear the resolved literal flag if we have backtracked from it
      unsigned depth=lms.size()-1;
      if(sresLiteral==depth) {
        sresLiteral=sresNoLiteral;
      }
      ASS(sresLiteral==sresNoLiteral || sresLiteral<depth);
    }
  }
}